

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsModelUtils.cpp
# Opt level: O2

void writeModelSolution(FILE *file,HighsLogOptions *log_options,HighsModel *model,
                       HighsSolution *solution,HighsInfo *info,bool sparse)

{
  vector<double,_std::allocator<double>_> *primal_solution;
  string *psVar1;
  bool bVar2;
  int iVar3;
  FILE *pFVar4;
  HighsLogOptions *log_options_;
  HighsInfo *pHVar5;
  ostream *poVar6;
  HighsInt ix;
  long lVar7;
  long lVar8;
  array<char,_32UL> valStr;
  string name;
  stringstream ss;
  string local_260;
  HighsModel *local_240;
  undefined1 *local_238;
  undefined8 local_230;
  undefined1 local_228 [16];
  FILE *local_218;
  HighsLogOptions *local_210;
  string local_208;
  HighsSolution *local_1e8;
  pointer local_1e0;
  pointer local_1d8;
  HighsInfo *local_1d0;
  pointer local_1c8;
  pointer local_1c0;
  stringstream local_1b8 [16];
  undefined1 local_1a8 [376];
  
  local_1c0 = (model->lp_).col_names_.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_1c8 = (model->lp_).col_names_.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  local_1d8 = (model->lp_).row_names_.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  local_1e0 = (model->lp_).row_names_.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  bVar2 = solution->value_valid;
  local_210 = (HighsLogOptions *)CONCAT71(local_210._1_7_,solution->dual_valid);
  local_1e8 = solution;
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::__cxx11::string::string
            ((string *)&local_260,"\n# Primal solution values\n",(allocator *)&local_238);
  highsFprintfString(file,log_options,&local_260);
  std::__cxx11::string::~string((string *)&local_260);
  local_240 = model;
  local_218 = file;
  local_1d0 = info;
  if (bVar2 == false) {
LAB_00264690:
    std::__cxx11::string::string((string *)&local_260,"None\n",(allocator *)&local_238);
    highsFprintfString(file,log_options,&local_260);
    std::__cxx11::string::~string((string *)&local_260);
  }
  else {
    iVar3 = (info->super_HighsInfoStruct).primal_solution_status;
    if (iVar3 == 2) {
      std::__cxx11::string::string((string *)&local_260,"Feasible\n",(allocator *)&local_238);
      highsFprintfString(file,log_options,&local_260);
    }
    else {
      if (iVar3 == 0) goto LAB_00264690;
      std::__cxx11::string::string((string *)&local_260,"Infeasible\n",(allocator *)&local_238);
      highsFprintfString(file,log_options,&local_260);
    }
    std::__cxx11::string::~string((string *)&local_260);
    primal_solution = &local_1e8->col_value;
    writeModelObjective(file,log_options,model,primal_solution);
    writePrimalSolution(file,log_options,&model->lp_,primal_solution,sparse);
    if (sparse) goto LAB_002647df;
    local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
    local_260._M_string_length = 0;
    local_260.field_2._M_local_buf[0] = '\0';
    psVar1 = (string *)(local_1a8 + 8);
    std::__cxx11::stringbuf::str(psVar1);
    std::__cxx11::string::~string((string *)&local_260);
    highsFormatToString_abi_cxx11_(&local_260,"# Rows %d\n",(ulong)(uint)(local_240->lp_).num_row_);
    std::operator<<((ostream *)local_1a8,(string *)&local_260);
    pFVar4 = local_218;
    std::__cxx11::string::~string((string *)&local_260);
    std::__cxx11::stringbuf::str();
    highsFprintfString(pFVar4,log_options,&local_260);
    std::__cxx11::string::~string((string *)&local_260);
    lVar7 = 0;
    for (lVar8 = 0; lVar8 < (local_240->lp_).num_row_; lVar8 = lVar8 + 1) {
      highsDoubleToString((array<char,_32UL> *)&local_260,
                          (local_1e8->row_value).super__Vector_base<double,_std::allocator<double>_>
                          ._M_impl.super__Vector_impl_data._M_start[lVar8],1e-13);
      local_238 = local_228;
      local_230 = 0;
      local_228[0] = 0;
      std::__cxx11::stringbuf::str(psVar1);
      std::__cxx11::string::~string((string *)&local_238);
      poVar6 = std::operator<<((ostream *)local_1a8,"R");
      std::ostream::operator<<(poVar6,(int)lVar8);
      if (local_1d8 == local_1e0) {
        std::__cxx11::stringbuf::str();
      }
      else {
        std::__cxx11::string::string
                  ((string *)&local_238,
                   (string *)
                   ((long)&(((local_240->lp_).row_names_.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar7))
        ;
      }
      local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
      local_208._M_string_length = 0;
      local_208.field_2._M_local_buf[0] = '\0';
      std::__cxx11::stringbuf::str(psVar1);
      std::__cxx11::string::~string((string *)&local_208);
      highsFormatToString_abi_cxx11_(&local_208,"%-s %s\n",local_238,&local_260);
      std::operator<<((ostream *)local_1a8,(string *)&local_208);
      std::__cxx11::string::~string((string *)&local_208);
      std::__cxx11::stringbuf::str();
      highsFprintfString(local_218,log_options,&local_208);
      std::__cxx11::string::~string((string *)&local_208);
      std::__cxx11::string::~string((string *)&local_238);
      lVar7 = lVar7 + 0x20;
    }
  }
  std::__cxx11::string::string
            ((string *)&local_260,"\n# Dual solution values\n",(allocator *)&local_238);
  pFVar4 = local_218;
  highsFprintfString(local_218,log_options,&local_260);
  pHVar5 = local_1d0;
  std::__cxx11::string::~string((string *)&local_260);
  if ((char)local_210 == '\0') {
LAB_0026471c:
    std::__cxx11::string::string((string *)&local_260,"None\n",(allocator *)&local_238);
    highsFprintfString(pFVar4,log_options,&local_260);
    std::__cxx11::string::~string((string *)&local_260);
  }
  else {
    iVar3 = (pHVar5->super_HighsInfoStruct).dual_solution_status;
    if (iVar3 == 2) {
      std::__cxx11::string::string((string *)&local_260,"Feasible\n",(allocator *)&local_238);
      highsFprintfString(pFVar4,log_options,&local_260);
    }
    else {
      if (iVar3 == 0) goto LAB_0026471c;
      std::__cxx11::string::string((string *)&local_260,"Infeasible\n",(allocator *)&local_238);
      highsFprintfString(pFVar4,log_options,&local_260);
    }
    std::__cxx11::string::~string((string *)&local_260);
    local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
    local_260._M_string_length = 0;
    local_260.field_2._M_local_buf[0] = '\0';
    psVar1 = (string *)(local_1a8 + 8);
    std::__cxx11::stringbuf::str(psVar1);
    std::__cxx11::string::~string((string *)&local_260);
    highsFormatToString_abi_cxx11_
              (&local_260,"# Columns %d\n",(ulong)(uint)(local_240->lp_).num_col_);
    std::operator<<((ostream *)local_1a8,(string *)&local_260);
    std::__cxx11::string::~string((string *)&local_260);
    std::__cxx11::stringbuf::str();
    local_210 = log_options;
    highsFprintfString(pFVar4,log_options,&local_260);
    std::__cxx11::string::~string((string *)&local_260);
    lVar8 = 0;
    for (lVar7 = 0; lVar7 < (local_240->lp_).num_col_; lVar7 = lVar7 + 1) {
      highsDoubleToString((array<char,_32UL> *)&local_260,
                          (local_1e8->col_dual).super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start[lVar7],1e-13);
      local_238 = local_228;
      local_230 = 0;
      local_228[0] = 0;
      std::__cxx11::stringbuf::str(psVar1);
      std::__cxx11::string::~string((string *)&local_238);
      poVar6 = std::operator<<((ostream *)local_1a8,"C");
      std::ostream::operator<<(poVar6,(int)lVar7);
      if (local_1c8 == local_1c0) {
        std::__cxx11::stringbuf::str();
      }
      else {
        std::__cxx11::string::string
                  ((string *)&local_238,
                   (string *)
                   ((long)&(((local_240->lp_).col_names_.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar8))
        ;
      }
      local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
      local_208._M_string_length = 0;
      local_208.field_2._M_local_buf[0] = '\0';
      std::__cxx11::stringbuf::str(psVar1);
      std::__cxx11::string::~string((string *)&local_208);
      highsFormatToString_abi_cxx11_(&local_208,"%-s %s\n",local_238,&local_260);
      std::operator<<((ostream *)local_1a8,(string *)&local_208);
      std::__cxx11::string::~string((string *)&local_208);
      std::__cxx11::stringbuf::str();
      highsFprintfString(local_218,local_210,&local_208);
      std::__cxx11::string::~string((string *)&local_208);
      std::__cxx11::string::~string((string *)&local_238);
      lVar8 = lVar8 + 0x20;
    }
    local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
    local_260._M_string_length = 0;
    local_260.field_2._M_local_buf[0] = '\0';
    std::__cxx11::stringbuf::str(psVar1);
    std::__cxx11::string::~string((string *)&local_260);
    highsFormatToString_abi_cxx11_(&local_260,"# Rows %d\n",(ulong)(uint)(local_240->lp_).num_row_);
    log_options_ = local_210;
    pFVar4 = local_218;
    std::operator<<((ostream *)local_1a8,(string *)&local_260);
    std::__cxx11::string::~string((string *)&local_260);
    std::__cxx11::stringbuf::str();
    highsFprintfString(pFVar4,log_options_,&local_260);
    std::__cxx11::string::~string((string *)&local_260);
    lVar8 = 0;
    for (lVar7 = 0; lVar7 < (local_240->lp_).num_row_; lVar7 = lVar7 + 1) {
      highsDoubleToString((array<char,_32UL> *)&local_260,
                          (local_1e8->row_dual).super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start[lVar7],1e-13);
      local_238 = local_228;
      local_230 = 0;
      local_228[0] = 0;
      std::__cxx11::stringbuf::str(psVar1);
      std::__cxx11::string::~string((string *)&local_238);
      poVar6 = std::operator<<((ostream *)local_1a8,"R");
      std::ostream::operator<<(poVar6,(int)lVar7);
      if (local_1d8 == local_1e0) {
        std::__cxx11::stringbuf::str();
      }
      else {
        std::__cxx11::string::string
                  ((string *)&local_238,
                   (string *)
                   ((long)&(((local_240->lp_).row_names_.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar8))
        ;
      }
      local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
      local_208._M_string_length = 0;
      local_208.field_2._M_local_buf[0] = '\0';
      std::__cxx11::stringbuf::str(psVar1);
      std::__cxx11::string::~string((string *)&local_208);
      highsFormatToString_abi_cxx11_(&local_208,"%-s %s\n",local_238,&local_260);
      std::operator<<((ostream *)local_1a8,(string *)&local_208);
      std::__cxx11::string::~string((string *)&local_208);
      std::__cxx11::stringbuf::str();
      highsFprintfString(local_218,local_210,&local_208);
      std::__cxx11::string::~string((string *)&local_208);
      std::__cxx11::string::~string((string *)&local_238);
      lVar8 = lVar8 + 0x20;
    }
  }
LAB_002647df:
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return;
}

Assistant:

void writeModelSolution(FILE* file, const HighsLogOptions& log_options,
                        const HighsModel& model, const HighsSolution& solution,
                        const HighsInfo& info, const bool sparse) {
  const HighsLp& lp = model.lp_;
  const bool have_col_names = lp.col_names_.size() > 0;
  const bool have_row_names = lp.row_names_.size() > 0;
  const bool have_primal = solution.value_valid;
  const bool have_dual = solution.dual_valid;
  if (have_col_names) assert((int)lp.col_names_.size() >= lp.num_col_);
  if (have_row_names) assert((int)lp.row_names_.size() >= lp.num_row_);
  if (have_primal) {
    assert((int)solution.col_value.size() >= lp.num_col_);
    assert((int)solution.row_value.size() >= lp.num_row_);
    assert(info.primal_solution_status != kSolutionStatusNone);
  }
  if (have_dual) {
    assert((int)solution.col_dual.size() >= lp.num_col_);
    assert((int)solution.row_dual.size() >= lp.num_row_);
    assert(info.dual_solution_status != kSolutionStatusNone);
  }
  std::stringstream ss;
  highsFprintfString(file, log_options, "\n# Primal solution values\n");
  if (!have_primal || info.primal_solution_status == kSolutionStatusNone) {
    highsFprintfString(file, log_options, "None\n");
  } else {
    if (info.primal_solution_status == kSolutionStatusFeasible) {
      highsFprintfString(file, log_options, "Feasible\n");
    } else {
      assert(info.primal_solution_status == kSolutionStatusInfeasible);
      highsFprintfString(file, log_options, "Infeasible\n");
    }
    writeModelObjective(file, log_options, model, solution.col_value);
    writePrimalSolution(file, log_options, model.lp_, solution.col_value,
                        sparse);
    if (sparse) return;
    ss.str(std::string());
    ss << highsFormatToString("# Rows %" HIGHSINT_FORMAT "\n", lp.num_row_);
    highsFprintfString(file, log_options, ss.str());
    for (HighsInt ix = 0; ix < lp.num_row_; ix++) {
      auto valStr = highsDoubleToString(solution.row_value[ix],
                                        kHighsSolutionValueToStringTolerance);
      // Create a row name
      ss.str(std::string());
      ss << "R" << ix;
      const std::string name = have_row_names ? lp.row_names_[ix] : ss.str();
      ss.str(std::string());
      ss << highsFormatToString("%-s %s\n", name.c_str(), valStr.data());
      highsFprintfString(file, log_options, ss.str());
    }
  }
  highsFprintfString(file, log_options, "\n# Dual solution values\n");
  if (!have_dual || info.dual_solution_status == kSolutionStatusNone) {
    highsFprintfString(file, log_options, "None\n");
  } else {
    if (info.dual_solution_status == kSolutionStatusFeasible) {
      highsFprintfString(file, log_options, "Feasible\n");
    } else {
      assert(info.dual_solution_status == kSolutionStatusInfeasible);
      highsFprintfString(file, log_options, "Infeasible\n");
    }
    ss.str(std::string());
    ss << highsFormatToString("# Columns %" HIGHSINT_FORMAT "\n", lp.num_col_);
    highsFprintfString(file, log_options, ss.str());
    for (HighsInt ix = 0; ix < lp.num_col_; ix++) {
      auto valStr = highsDoubleToString(solution.col_dual[ix],
                                        kHighsSolutionValueToStringTolerance);
      ss.str(std::string());
      ss << "C" << ix;
      const std::string name = have_col_names ? lp.col_names_[ix] : ss.str();
      ss.str(std::string());
      ss << highsFormatToString("%-s %s\n", name.c_str(), valStr.data());
      highsFprintfString(file, log_options, ss.str());
    }
    ss.str(std::string());
    ss << highsFormatToString("# Rows %" HIGHSINT_FORMAT "\n", lp.num_row_);
    highsFprintfString(file, log_options, ss.str());
    for (HighsInt ix = 0; ix < lp.num_row_; ix++) {
      auto valStr = highsDoubleToString(solution.row_dual[ix],
                                        kHighsSolutionValueToStringTolerance);
      ss.str(std::string());
      ss << "R" << ix;
      const std::string name = have_row_names ? lp.row_names_[ix] : ss.str();
      ss.str(std::string());
      ss << highsFormatToString("%-s %s\n", name.c_str(), valStr.data());
      highsFprintfString(file, log_options, ss.str());
    }
  }
}